

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChDebugDrawer::drawLine
          (ChDebugDrawer *this,cbtVector3 *from,cbtVector3 *to,cbtVector3 *color)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)from->m_floats;
  vcvtps2pd_avx(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)to->m_floats;
  vcvtps2pd_avx(auVar2);
  (**(code **)(*(long *)this->m_vis + 0x10))();
  return;
}

Assistant:

void drawLine(const cbtVector3& from, const cbtVector3& to, const cbtVector3& color) override {
        m_vis->DrawLine(ChVector<>(from.x(), from.y(), from.z()), ChVector<>(to.x(), to.y(), to.z()),
                        ChColor(color.x(), color.y(), color.z()));
    }